

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O1

void MPIX_INAPsend(void *buf,NAPComm *nap_comm,MPI_Datatype datatype,int tag,MPI_Comm comm,
                  NAPData *nap_data)

{
  int size;
  MPI_Request *send_requests;
  MPI_Request *recv_requests;
  char *send_data;
  undefined8 *puVar1;
  char *pcVar2;
  char *local_S_recv_data;
  char *L_send_buffer;
  char *global_send_buffer;
  int type_size;
  char *local_60;
  char *local_58;
  char *local_50;
  void *local_48;
  MPI_Datatype local_40;
  undefined1 local_34 [4];
  
  puVar1 = (undefined8 *)operator_new(0x28);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  *(undefined **)(datatype + 0x18) = &ompi_mpi_comm_world;
  puVar1[3] = &ompi_mpi_int;
  *(undefined4 *)(puVar1 + 4) = 0x4fc7;
  local_60 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  send_requests = nap_comm->send_requests;
  recv_requests = nap_comm->recv_requests;
  local_40 = datatype;
  MPI_Type_size(&ompi_mpi_int,local_34);
  local_48 = buf;
  MPIX_step_comm(nap_comm->local_S_comm,buf,&local_60,0x4fc8,nap_comm->topo_info->local_comm,
                 (MPI_Datatype)&ompi_mpi_int,(MPI_Datatype)&ompi_mpi_int,send_requests,recv_requests
                );
  send_data = local_60;
  size = nap_comm->local_S_comm->recv_data->size_msgs;
  if (size != 0) {
    pcVar2 = MPIX_NAP_unpack(local_60,size,(MPI_Datatype)&ompi_mpi_int,
                             (MPI_Comm)&ompi_mpi_comm_world);
    MPIX_step_send(nap_comm->global_comm,send_data,0x4fc7,(MPI_Comm)&ompi_mpi_comm_world,
                   (MPI_Datatype)&ompi_mpi_int,send_requests,&local_50);
    operator_delete__(pcVar2);
  }
  if (nap_comm->local_L_comm->send_data->num_msgs != 0) {
    MPIX_step_send(nap_comm->local_L_comm,local_48,0x4fca,nap_comm->topo_info->local_comm,
                   (MPI_Datatype)&ompi_mpi_int,
                   send_requests + nap_comm->global_comm->send_data->num_msgs,&local_58);
  }
  puVar1[1] = local_50;
  puVar1[2] = local_58;
  *(undefined8 **)local_40 = puVar1;
  if (local_60 != (char *)0x0) {
    operator_delete__(local_60);
  }
  return;
}

Assistant:

static void MPIX_INAPsend(void* buf, NAPComm* nap_comm,
        MPI_Datatype datatype, int tag,
        MPI_Comm comm, NAPData* nap_data)
{
    NAPCommData* nap_send_data = new NAPCommData();
    nap_data->mpi_comm = comm;
    nap_send_data->datatype = datatype;
    nap_send_data->tag = tag;

    int local_S_tag = tag + 1;
    int local_L_tag = tag + 3;
    int size, type_size, ctr;

    char* local_L_recv_data = NULL;
    char* local_S_recv_data = NULL;
    char* global_send_buffer = NULL;
    char* L_send_buffer = NULL;
    MPI_Request* send_requests = nap_comm->send_requests;
    MPI_Request* recv_requests = nap_comm->recv_requests;
    MPI_Request* L_send_requests = NULL;

    MPI_Type_size(datatype, &type_size);

    // Initial intra-node redistribution (step 1 in nap comm)
    MPIX_step_comm(nap_comm->local_S_comm, buf, &local_S_recv_data,
            local_S_tag, nap_comm->topo_info->local_comm, datatype, datatype,
            send_requests, recv_requests);

    if (nap_comm->local_S_comm->recv_data->size_msgs)
    {
        // Unpack previous recv into void*
        char* unpacked_buf = MPIX_NAP_unpack(local_S_recv_data, 
                nap_comm->local_S_comm->recv_data->size_msgs,
                datatype, comm);

        // Initialize Isends for inter-node step (step 2 in nap comm)
        MPIX_step_send(nap_comm->global_comm, local_S_recv_data, tag,
                comm, datatype, send_requests, &global_send_buffer);

        // Free void* buffer (packed into char* buf)
        delete[] unpacked_buf;
    }

    if (nap_comm->local_L_comm->send_data->num_msgs)
    {
        L_send_requests = &(send_requests[nap_comm->global_comm->send_data->num_msgs]);
        MPIX_step_send(nap_comm->local_L_comm, buf, local_L_tag, 
                nap_comm->topo_info->local_comm, datatype, L_send_requests, &L_send_buffer);
    }

    // Store global_send_requests and global_send_buffer, as to not free data
    // before sends are finished
    nap_send_data->global_buffer = global_send_buffer;
    nap_send_data->local_L_buffer = L_send_buffer;
    nap_data->send_data = nap_send_data;

    if (local_S_recv_data) delete[] local_S_recv_data;
}